

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O3

void soplex::
     updateScaleFinal<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecnnzeroes,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *resnvec,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *tmpvec,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **psccurr,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **pscprev,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *q,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eprev1,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eprev2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *epsilon)

{
  fpclass_type fVar1;
  int32_t iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  bool bVar8;
  fpclass_type fVar9;
  undefined8 uVar10;
  int32_t iVar11;
  int iVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  long lVar14;
  byte bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  uint *puVar17;
  undefined4 *puVar18;
  uint *puVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  uint local_248 [3];
  undefined3 uStack_23b;
  int iStack_238;
  bool bStack_234;
  undefined8 local_230;
  uint local_224 [27];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 local_40;
  
  bVar20 = 0;
  local_230._0_4_ = cpp_dec_float_finite;
  local_230._4_4_ = 0x1c;
  local_2a8 = ZEXT816(0);
  local_298 = ZEXT816(0);
  local_288 = ZEXT816(0);
  local_278 = ZEXT816(0);
  local_268 = ZEXT816(0);
  local_258 = ZEXT816(0);
  local_248[0] = 0;
  local_248[1] = 0;
  stack0xfffffffffffffdc0 = 0;
  uStack_23b = 0;
  iStack_238 = 0;
  bStack_234 = false;
  pcVar13 = &eprev1->m_backend;
  if (((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *)local_2a8 != eprev2) &&
     (pcVar13 = &eprev2->m_backend,
     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      *)local_2a8 != eprev1)) {
    puVar17 = (uint *)eprev1;
    puVar18 = (undefined4 *)local_2a8;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar18 = *puVar17;
      puVar17 = puVar17 + 1;
      puVar18 = puVar18 + 1;
    }
    iStack_238 = (eprev1->m_backend).exp;
    bStack_234 = (eprev1->m_backend).neg;
    local_230._0_4_ = (eprev1->m_backend).fpclass;
    local_230._4_4_ = (eprev1->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_2a8,pcVar13);
  uVar10 = local_230;
  bVar8 = bStack_234;
  iVar7 = iStack_238;
  uVar6 = local_2a8._0_4_;
  puVar17 = (uint *)(local_2a8 + 4);
  puVar19 = local_224;
  for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar17;
    puVar17 = puVar17 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  fVar9 = (fpclass_type)local_230;
  iVar11 = local_230._4_4_;
  bVar4 = local_2a8._0_4_ != 0;
  bVar5 = (fpclass_type)local_230 != cpp_dec_float_finite;
  bVar3 = bVar4 || bVar5;
  bVar15 = bStack_234 ^ bVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator-=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,*psccurr);
  pnVar16 = epsilon;
  pcVar13 = &local_138;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar13->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar20 * -2 + 1) * 4);
  }
  local_138.exp = (epsilon->m_backend).exp;
  local_138.neg = (epsilon->m_backend).neg;
  fVar1 = (epsilon->m_backend).fpclass;
  iVar2 = (epsilon->m_backend).prec_elem;
  local_138.fpclass = fVar1;
  local_138.prec_elem = iVar2;
  local_2a8 = CONCAT124(local_2a8._4_12_,uVar6);
  puVar17 = local_224;
  puVar19 = (uint *)(local_2a8 + 4);
  for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar17;
    puVar17 = puVar17 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  iStack_238 = iVar7;
  bStack_234 = (bool)bVar15;
  local_230 = uVar10;
  if (bVar8 != bVar3 && (bVar4 || bVar5)) {
    bStack_234 = (bool)(bVar15 ^ 1);
  }
  if ((fVar1 == cpp_dec_float_NaN || fVar9 == cpp_dec_float_NaN) ||
     (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_2a8,&local_138), 0 < iVar12)) {
    local_1b8.m_backend.data._M_elems[0] = uVar6;
    puVar17 = local_224;
    puVar19 = local_1b8.m_backend.data._M_elems + 1;
    for (lVar14 = 0x1b; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar19 = *puVar17;
      puVar17 = puVar17 + (ulong)bVar20 * -2 + 1;
      puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
    }
    local_1b8.m_backend.exp = iVar7;
    local_1b8.m_backend.fpclass = fVar9;
    local_1b8.m_backend.prec_elem = iVar11;
    local_1b8.m_backend.neg = (bool)bVar15;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)*pscprev,&local_1b8);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(*pscprev);
  }
  vec = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)tmpvec,resnvec,vecnnzeroes);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,vec);
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x1c;
  local_b8 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  uStack_48._0_4_ = 0;
  uStack_48._4_1_ = false;
  local_230._0_4_ = cpp_dec_float_finite;
  local_230._4_4_ = 0x1c;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_248[0] = 0;
  local_248[1] = 0;
  stack0xfffffffffffffdc0 = 0;
  uStack_23b = 0;
  iStack_238 = 0;
  bStack_234 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_2a8,1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_b8,(cpp_dec_float<200U,_int,_void> *)local_2a8,
             &q->m_backend);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_b8);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,*psccurr);
  *psccurr = *pscprev;
  return;
}

Assistant:

static void updateScaleFinal(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R q,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(q != 0);
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);

   R fac = -(eprev1 * eprev2);

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);
   *pscprev *= 1.0 / q;
   *pscprev += *psccurr;

   psccurr = pscprev;
}